

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  u32 uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int iVal;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < nChunk) {
    uVar7 = 0;
    do {
      local_3c = 0xaaaaaaaa;
      iVar1 = sqlite3Fts5GetVarint32(pChunk + uVar7,&local_3c);
      iVar2 = *(int *)((long)pContext + 0x10);
      uVar5 = (local_3c + iVar2) - 2;
      *(u32 *)((long)pContext + 0x10) = uVar5;
      lVar3 = (long)**(int **)((long)pContext + 8);
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          if ((*(int **)((long)pContext + 8))[lVar4 + 1] == uVar5) {
            iVar2 = local_3c + iVar2;
            local_3c = uVar5;
            iVar2 = sqlite3Fts5PutVarint
                              ((uchar *)((long)(int)(*pContext)[1] + **pContext),
                               (long)(iVar2 - *(int *)((long)pContext + 0x14)));
            *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + iVar2;
            *(u32 *)((long)pContext + 0x14) = uVar5;
            uVar5 = local_3c;
            break;
          }
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      local_3c = uVar5;
      uVar6 = (int)uVar7 + iVar1;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 < nChunk);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused,
  void *pContext,
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}